

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

uchar matchHuff(FILE *f,uchar number,uchar ACorDC)

{
  bool bVar1;
  mapped_type *pmVar2;
  ulong uVar3;
  ulong uVar4;
  pair<int,_unsigned_int> local_50;
  pair<unsigned_char,_unsigned_int> local_48;
  _Self local_40;
  pair<int,_unsigned_int> local_38;
  pair<unsigned_char,_unsigned_int> local_30;
  _Self local_28;
  int local_20 [2];
  int count;
  byte local_12;
  uchar codeLen;
  uint len;
  uchar ACorDC_local;
  uchar number_local;
  FILE *f_local;
  
  count = 0;
  local_20[0] = 1;
  local_12 = ACorDC;
  codeLen = number;
  _len = f;
  while( true ) {
    count = count << 1;
    bVar1 = getBit(_len);
    count = (uint)bVar1 + count;
    uVar3 = (ulong)local_12;
    uVar4 = (ulong)codeLen;
    local_38 = std::make_pair<int&,unsigned_int&>(local_20,(uint *)&count);
    std::pair<unsigned_char,_unsigned_int>::pair<int,_unsigned_int,_true>(&local_30,&local_38);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
         ::find(huffTable[uVar3] + uVar4,&local_30);
    local_40._M_node =
         (_Base_ptr)
         std::
         map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
         ::end(huffTable[local_12] + codeLen);
    bVar1 = std::operator!=(&local_28,&local_40);
    if (bVar1) break;
    if (0x10 < local_20[0]) {
      fprintf(_stderr,"key not found\n");
      local_20[0] = 1;
      count = 0;
    }
    local_20[0] = local_20[0] + 1;
  }
  uVar3 = (ulong)local_12;
  uVar4 = (ulong)codeLen;
  local_50 = std::make_pair<int&,unsigned_int&>(local_20,(uint *)&count);
  std::pair<unsigned_char,_unsigned_int>::pair<int,_unsigned_int,_true>(&local_48,&local_50);
  pmVar2 = std::
           map<std::pair<unsigned_char,_unsigned_int>,_unsigned_char,_std::less<std::pair<unsigned_char,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_char,_unsigned_int>,_unsigned_char>_>_>
           ::operator[](huffTable[uVar3] + uVar4,&local_48);
  return *pmVar2;
}

Assistant:

unsigned char matchHuff(FILE *f, unsigned char number, unsigned char ACorDC) {
    unsigned int len = 0;
    unsigned char codeLen;
    for (int count = 1; ; count++) {
        len = len << 1;
        len += (unsigned int)getBit(f);
        if (huffTable[ACorDC][number].find(std::make_pair(count, len)) != huffTable[ACorDC][number].end()) {
            codeLen = huffTable[ACorDC][number][std::make_pair(count, len)];
            return codeLen;
        }
        if (count > 16) {fprintf(stderr, "key not found\n"); count = 1; len = 0;}
    }
}